

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O1

h__Writer * __thiscall
ASDCP::DCData::MXFWriter::h__Writer::WriteFrame
          (h__Writer *this,FrameBuffer *FrameBuf,AESEncContext *Ctx,HMACContext *HMAC)

{
  ui32_t *puVar1;
  ui64_t uVar2;
  undefined **local_98;
  i8_t local_90;
  i8_t iStack_8f;
  ui8_t local_8e;
  ui64_t local_88;
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  if (*(int *)&FrameBuf[0x16].super_FrameBuffer._vptr_FrameBuffer == 2) {
    *(undefined4 *)&FrameBuf[0x16].super_FrameBuffer._vptr_FrameBuffer = 3;
    Kumu::Result_t::Result_t((Result_t *)&stack0xffffffffffffff68,(Result_t *)Kumu::RESULT_OK);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
  }
  uVar2._0_4_ = FrameBuf[0x14].super_FrameBuffer.m_SourceLength;
  uVar2._4_4_ = FrameBuf[0x14].super_FrameBuffer.m_PlaintextOffset;
  if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                    _vptr_TrackFileWriter) {
    h__ASDCPWriter::WriteEKLVPacket
              ((h__ASDCPWriter *)&stack0xffffffffffffff68,&FrameBuf->super_FrameBuffer,(byte_t *)Ctx
               ,(ui32_t *)&FrameBuf[0x2d].super_FrameBuffer.m_OwnMem,
               (AESEncContext *)&MXF_BER_LENGTH,HMAC);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
  }
  if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                    _vptr_TrackFileWriter) {
    local_98 = &PTR__IArchive_00224af0;
    local_90 = '\0';
    iStack_8f = '\0';
    local_8e = 0x80;
    local_88 = uVar2;
    MXF::OPAtomIndexFooter::PushIndexEntry
              ((OPAtomIndexFooter *)&FrameBuf[0x22].super_FrameBuffer.m_Size,
               (IndexEntry *)&stack0xffffffffffffff68);
    puVar1 = &FrameBuf[0x14].super_FrameBuffer.m_Size;
    *puVar1 = *puVar1 + 1;
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFWriter::h__Writer::WriteFrame(const FrameBuffer& FrameBuf,
                                                ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  Result_t result = RESULT_OK;

  if ( m_State.Test_READY() )
    result = m_State.Goto_RUNNING(); // first time through

  ui64_t StreamOffset = m_StreamOffset;

  if ( ASDCP_SUCCESS(result) )
    result = WriteEKLVPacket(FrameBuf, m_EssenceUL, MXF_BER_LENGTH, Ctx, HMAC);

  if ( ASDCP_SUCCESS(result) )
  {
    IndexTableSegment::IndexEntry Entry;
    Entry.StreamOffset = StreamOffset;
    m_FooterPart.PushIndexEntry(Entry);
    m_FramesWritten++;
  }
  return result;
}